

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O1

EncodingState *
ZXing::Aztec::AddBinaryShiftChar
          (EncodingState *__return_storage_ptr__,EncodingState *state,int index)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> local_70;
  EncodingState local_58;
  
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&local_70,&state->tokens);
  iVar3 = state->mode;
  iVar5 = state->bitCount;
  if (((long)iVar3 == 4) || (iVar3 == 2)) {
    uVar4 = *(uint *)(LATCH_TABLE + (long)iVar3 * 0x14);
    local_58.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (uVar4 & 0xffff) - (uVar4 & 0xffff0000);
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
    emplace_back<ZXing::Aztec::Token>(&local_70,(Token *)&local_58);
    iVar5 = iVar5 + ((int)uVar4 >> 0x10);
    iVar3 = 0;
  }
  iVar1 = state->binaryShiftByteCount;
  uVar4 = 0x12;
  if ((iVar1 != 0) && (iVar1 != 0x1f)) {
    uVar4 = iVar1 == 0x3e | 8;
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,&local_70);
  __return_storage_ptr__->mode = iVar3;
  iVar3 = state->binaryShiftByteCount + 1;
  __return_storage_ptr__->binaryShiftByteCount = iVar3;
  __return_storage_ptr__->bitCount = uVar4 + iVar5;
  if (iVar3 == 0x81e) {
    EndBinaryShift(&local_58,__return_storage_ptr__,index + 1);
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::_M_move_assign
              (&__return_storage_ptr__->tokens,&local_58);
    __return_storage_ptr__->bitCount = local_58.bitCount;
    __return_storage_ptr__->mode = local_58.mode;
    __return_storage_ptr__->binaryShiftByteCount = local_58.binaryShiftByteCount;
    pvVar2 = (void *)CONCAT44(local_58.tokens.
                              super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_58.tokens.
                                   super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_58.tokens.
                                   super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2
                     );
    }
  }
  if (local_70.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static EncodingState AddBinaryShiftChar(const EncodingState& state, int index)
{
	auto tokens = state.tokens;
	int mode = state.mode;
	int bitCount = state.bitCount;
	if (state.mode == MODE_PUNCT || state.mode == MODE_DIGIT) {
		//assert binaryShiftByteCount == 0;
		int latch = LATCH_TABLE[mode][MODE_UPPER];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
		mode = MODE_UPPER;
	}
	int deltaBitCount = (state.binaryShiftByteCount == 0 || state.binaryShiftByteCount == 31) ? 18 : (state.binaryShiftByteCount == 62) ? 9 : 8;
	EncodingState result{ tokens, mode, state.binaryShiftByteCount + 1, bitCount + deltaBitCount };
	if (result.binaryShiftByteCount == 2047 + 31) {
		// The string is as long as it's allowed to be.  We should end it.
		result = EndBinaryShift(result, index + 1);
	}
	return result;
}